

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_257,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  RayQueryContext *extraout_RDX;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar38;
  float fVar39;
  vint4 bi_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar53;
  float fVar54;
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar61;
  float fVar62;
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  float fVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar74;
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar86;
  float fVar89;
  vint4 bi_3;
  float fVar87;
  float fVar90;
  float fVar92;
  undefined1 auVar84 [16];
  float fVar88;
  float fVar91;
  undefined1 auVar85 [16];
  float fVar93;
  float fVar96;
  float fVar98;
  vint4 bi;
  float fVar100;
  undefined1 auVar94 [16];
  float fVar97;
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  ulong local_1098;
  RayHit *local_1090;
  Intersectors *local_1088;
  RayQueryContext *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1080 = context;
  local_1088 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar21 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar49 = rsqrtss(auVar21,auVar21);
    fVar19 = auVar49._0_4_;
    local_fb8[0] = fVar19 * 1.5 - fVar19 * fVar19 * auVar21._0_4_ * 0.5 * fVar19;
    auVar73._0_4_ = local_fe8 * local_fb8[0];
    auVar73._4_4_ = local_ff8 * local_fb8[0];
    auVar73._8_4_ = local_fd8 * local_fb8[0];
    auVar73._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar14 = CONCAT44(auVar73._4_4_,auVar73._4_4_);
    auVar22._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar22._8_4_ = -auVar73._12_4_;
    auVar22._12_4_ = -auVar73._12_4_;
    auVar63._0_12_ = ZEXT812(0);
    auVar63._12_4_ = 0;
    auVar22 = blendps(auVar22,auVar63,0xe);
    auVar21._4_4_ = auVar22._0_4_;
    auVar21._0_4_ = auVar73._8_4_;
    auVar21._8_4_ = auVar22._4_4_;
    auVar21._12_4_ = 0;
    auVar49._4_4_ = auVar22._0_4_;
    auVar49._0_4_ = auVar73._8_4_;
    auVar49._8_4_ = auVar22._4_4_;
    auVar49._12_4_ = 0;
    auVar77 = dpps(auVar49 << 0x20,auVar21 << 0x20,0x7f);
    uVar14 = CONCAT44(auVar73._12_4_,auVar73._8_4_);
    auVar68._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar68._8_4_ = -auVar73._8_4_;
    auVar68._12_4_ = -auVar73._12_4_;
    auVar22 = insertps(auVar68,auVar73,0x2a);
    auVar49 = dpps(auVar22,auVar22,0x7f);
    iVar18 = -(uint)(auVar49._0_4_ < auVar77._0_4_);
    auVar77._4_4_ = iVar18;
    auVar77._0_4_ = iVar18;
    auVar77._8_4_ = iVar18;
    auVar77._12_4_ = iVar18;
    auVar21 = blendvps(auVar22,auVar21 << 0x20,auVar77);
    auVar49 = dpps(auVar21,auVar21,0x7f);
    auVar22 = rsqrtss(auVar49,auVar49);
    fVar19 = auVar22._0_4_;
    fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * auVar49._0_4_ * 0.5 * fVar19;
    fVar20 = fVar19 * auVar21._0_4_;
    fVar38 = fVar19 * auVar21._4_4_;
    fVar39 = fVar19 * auVar21._8_4_;
    fVar19 = fVar19 * auVar21._12_4_;
    fVar67 = fVar38 * auVar73._0_4_ - auVar73._4_4_ * fVar20;
    fVar74 = fVar39 * auVar73._4_4_ - auVar73._8_4_ * fVar38;
    fVar75 = fVar20 * auVar73._8_4_ - auVar73._0_4_ * fVar39;
    auVar69._12_4_ = fVar19 * auVar73._12_4_ - auVar73._12_4_ * fVar19;
    auVar69._0_8_ = CONCAT44(fVar75,fVar74);
    auVar69._8_4_ = fVar67;
    auVar76._8_4_ = fVar67;
    auVar76._0_8_ = auVar69._0_8_;
    auVar76._12_4_ = auVar69._12_4_;
    auVar21 = dpps(auVar76,auVar69,0x7f);
    auVar49 = rsqrtss(auVar21,auVar21);
    fVar19 = auVar49._0_4_;
    fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * auVar21._0_4_ * 0.5 * fVar19;
    local_f88._4_4_ = fVar19 * fVar67;
    local_f88._0_4_ = fVar39;
    local_f88._8_4_ = auVar73._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar19 * fVar75;
    local_f98._0_4_ = fVar38;
    local_f98._8_4_ = auVar73._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar19 * fVar74;
    local_fa8._0_4_ = fVar20;
    local_fa8._8_4_ = auVar73._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar15 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar20 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar38 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar39 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar67 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar19 = 0.0;
    if (0.0 <= fVar67) {
      fVar19 = fVar67;
    }
    fVar67 = (ray->super_RayK<1>).tfar;
    fVar74 = 0.0;
    if (0.0 <= fVar67) {
      fVar74 = fVar67;
    }
    auVar23._4_4_ = -(uint)(ABS(local_ff8) < 1e-18);
    auVar23._0_4_ = -(uint)(ABS(local_fe8) < 1e-18);
    auVar23._8_4_ = -(uint)(ABS(local_fd8) < 1e-18);
    auVar23._12_4_ = -(uint)(ABS(aVar2.field_3.w) < 1e-18);
    auVar21 = divps(_DAT_01f7ba10,(undefined1  [16])aVar2);
    auVar21 = blendvps(auVar21,_DAT_01fab950,auVar23);
    fVar82 = auVar21._0_4_ * 0.99999964;
    fVar86 = auVar21._4_4_ * 0.99999964;
    fVar89 = auVar21._8_4_ * 0.99999964;
    fVar79 = auVar21._0_4_ * 1.0000004;
    fVar80 = auVar21._4_4_ * 1.0000004;
    fVar81 = auVar21._8_4_ * 1.0000004;
    fStack_fe4 = local_fe8;
    fStack_fe0 = local_fe8;
    fStack_fdc = local_fe8;
    fStack_ff4 = local_ff8;
    fStack_ff0 = local_ff8;
    fStack_fec = local_ff8;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    uVar14 = (ulong)(fVar82 < 0.0) << 4;
    uVar16 = (ulong)(fVar86 < 0.0) << 4 | 0x20;
    uVar17 = (ulong)(fVar89 < 0.0) << 4 | 0x40;
    uVar13 = uVar14 ^ 0x10;
    auVar78._4_4_ = fVar19;
    auVar78._0_4_ = fVar19;
    auVar78._8_4_ = fVar19;
    auVar78._12_4_ = fVar19;
    local_1090 = ray;
    local_fc8 = fVar39;
    fStack_fc4 = fVar39;
    fStack_fc0 = fVar39;
    fStack_fbc = fVar39;
    local_1018 = auVar78;
    local_1028 = fVar81;
    fStack_1024 = fVar81;
    fStack_1020 = fVar81;
    fStack_101c = fVar81;
    local_1038 = fVar89;
    fStack_1034 = fVar89;
    fStack_1030 = fVar89;
    fStack_102c = fVar89;
    local_1048 = fVar20;
    fStack_1044 = fVar20;
    fStack_1040 = fVar20;
    fStack_103c = fVar20;
    local_1058 = fVar38;
    fStack_1054 = fVar38;
    fStack_1050 = fVar38;
    fStack_104c = fVar38;
    local_1098 = uVar14;
    local_1068 = fVar82;
    fStack_1064 = fVar82;
    fStack_1060 = fVar82;
    fStack_105c = fVar82;
    local_1078 = fVar86;
    fStack_1074 = fVar86;
    fStack_1070 = fVar86;
    fStack_106c = fVar86;
    local_10a8 = fVar79;
    fStack_10a4 = fVar79;
    fStack_10a0 = fVar79;
    fStack_109c = fVar79;
    local_10b8 = fVar80;
    fStack_10b4 = fVar80;
    fStack_10b0 = fVar80;
    fStack_10ac = fVar80;
    fVar19 = fVar74;
    fVar67 = fVar74;
    fVar75 = fVar74;
    fVar66 = fVar82;
    fVar40 = fVar82;
    fVar45 = fVar82;
    fVar103 = fVar39;
    fVar104 = fVar39;
    fVar105 = fVar39;
    fVar46 = fVar38;
    fVar47 = fVar38;
    fVar48 = fVar38;
    fVar53 = fVar20;
    fVar54 = fVar20;
    fVar55 = fVar20;
    fVar56 = fVar79;
    fVar61 = fVar79;
    fVar62 = fVar79;
    fVar83 = fVar80;
    fVar88 = fVar80;
    fVar91 = fVar80;
    fVar93 = fVar81;
    fVar97 = fVar81;
    fVar99 = fVar81;
    fVar87 = fVar89;
    fVar90 = fVar89;
    fVar92 = fVar89;
    fVar96 = fVar86;
    fVar98 = fVar86;
    fVar100 = fVar86;
    do {
      pauVar9 = pauVar15 + -1;
      pauVar15 = pauVar15 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar9 + 8) < *pfVar1 || *(float *)((long)*pauVar9 + 8) == *pfVar1) {
        uVar10 = *(ulong *)*pauVar15;
LAB_00d8bbb7:
        if ((uVar10 & 0xf) == 0) {
          pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
          auVar24._0_4_ = (*pfVar1 - fVar20) * fVar82;
          auVar24._4_4_ = (pfVar1[1] - fVar53) * fVar66;
          auVar24._8_4_ = (pfVar1[2] - fVar54) * fVar40;
          auVar24._12_4_ = (pfVar1[3] - fVar55) * fVar45;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
          auVar41._0_4_ = (*pfVar1 - fVar38) * fVar86;
          auVar41._4_4_ = (pfVar1[1] - fVar46) * fVar96;
          auVar41._8_4_ = (pfVar1[2] - fVar47) * fVar98;
          auVar41._12_4_ = (pfVar1[3] - fVar48) * fVar100;
          auVar21 = maxps(auVar24,auVar41);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar17);
          auVar42._0_4_ = (*pfVar1 - fVar39) * fVar89;
          auVar42._4_4_ = (pfVar1[1] - fVar103) * fVar87;
          auVar42._8_4_ = (pfVar1[2] - fVar104) * fVar90;
          auVar42._12_4_ = (pfVar1[3] - fVar105) * fVar92;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar13);
          auVar50._0_4_ = (*pfVar1 - fVar20) * fVar79;
          auVar50._4_4_ = (pfVar1[1] - fVar53) * fVar56;
          auVar50._8_4_ = (pfVar1[2] - fVar54) * fVar61;
          auVar50._12_4_ = (pfVar1[3] - fVar55) * fVar62;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
          auVar57._0_4_ = (*pfVar1 - fVar38) * fVar80;
          auVar57._4_4_ = (pfVar1[1] - fVar46) * fVar83;
          auVar57._8_4_ = (pfVar1[2] - fVar47) * fVar88;
          auVar57._12_4_ = (pfVar1[3] - fVar48) * fVar91;
          auVar22 = minps(auVar50,auVar57);
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar17 ^ 0x10));
          auVar58._0_4_ = (*pfVar1 - fVar39) * fVar81;
          auVar58._4_4_ = (pfVar1[1] - fVar103) * fVar93;
          auVar58._8_4_ = (pfVar1[2] - fVar104) * fVar97;
          auVar58._12_4_ = (pfVar1[3] - fVar105) * fVar99;
          auVar49 = maxps(auVar42,auVar78);
          _local_10c8 = maxps(auVar21,auVar49);
          auVar8._4_4_ = fVar19;
          auVar8._0_4_ = fVar74;
          auVar8._8_4_ = fVar67;
          auVar8._12_4_ = fVar75;
          auVar21 = minps(auVar58,auVar8);
          auVar21 = minps(auVar22,auVar21);
          auVar25._4_4_ = -(uint)(local_10c8._4_4_ <= auVar21._4_4_);
          auVar25._0_4_ = -(uint)(local_10c8._0_4_ <= auVar21._0_4_);
          auVar25._8_4_ = -(uint)(local_10c8._8_4_ <= auVar21._8_4_);
          auVar25._12_4_ = -(uint)(local_10c8._12_4_ <= auVar21._12_4_);
          uVar12 = movmskps((int)context,auVar25);
        }
        else {
          if ((int)(uVar10 & 0xf) != 2) {
            (**(code **)((long)local_1088->leafIntersector +
                        (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1080);
            fVar74 = (local_1090->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1090;
            uVar14 = local_1098;
            fVar19 = fVar74;
            fVar67 = fVar74;
            fVar75 = fVar74;
            auVar78 = local_1018;
            fVar82 = local_1068;
            fVar66 = fStack_1064;
            fVar40 = fStack_1060;
            fVar45 = fStack_105c;
            fVar39 = local_fc8;
            fVar103 = fStack_fc4;
            fVar104 = fStack_fc0;
            fVar105 = fStack_fbc;
            fVar38 = local_1058;
            fVar46 = fStack_1054;
            fVar47 = fStack_1050;
            fVar48 = fStack_104c;
            fVar20 = local_1048;
            fVar53 = fStack_1044;
            fVar54 = fStack_1040;
            fVar55 = fStack_103c;
            fVar79 = local_10a8;
            fVar56 = fStack_10a4;
            fVar61 = fStack_10a0;
            fVar62 = fStack_109c;
            fVar80 = local_10b8;
            fVar83 = fStack_10b4;
            fVar88 = fStack_10b0;
            fVar91 = fStack_10ac;
            fVar81 = local_1028;
            fVar93 = fStack_1024;
            fVar97 = fStack_1020;
            fVar99 = fStack_101c;
            fVar89 = local_1038;
            fVar87 = fStack_1034;
            fVar90 = fStack_1030;
            fVar92 = fStack_102c;
            fVar86 = local_1078;
            fVar96 = fStack_1074;
            fVar98 = fStack_1070;
            fVar100 = fStack_106c;
            goto LAB_00d8c14c;
          }
          uVar11 = uVar10 & 0xfffffffffffffff0;
          local_1008 = *(float *)(uVar11 + 0x70);
          fStack_1004 = *(float *)(uVar11 + 0x74);
          fStack_1000 = *(float *)(uVar11 + 0x78);
          fStack_ffc = *(float *)(uVar11 + 0x7c);
          auVar102._0_4_ = local_ff8 * local_1008 + local_fd8 * *(float *)(uVar11 + 0xa0);
          auVar102._4_4_ = fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar11 + 0xa4);
          auVar102._8_4_ = fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar11 + 0xa8);
          auVar102._12_4_ = fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar11 + 0xac);
          auVar84._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x20) +
               local_ff8 * *(float *)(uVar11 + 0x50) + local_fd8 * *(float *)(uVar11 + 0x80);
          auVar84._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x24) +
               fStack_ff4 * *(float *)(uVar11 + 0x54) + fStack_fd4 * *(float *)(uVar11 + 0x84);
          auVar84._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x28) +
               fStack_ff0 * *(float *)(uVar11 + 0x58) + fStack_fd0 * *(float *)(uVar11 + 0x88);
          auVar84._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x2c) +
               fStack_fec * *(float *)(uVar11 + 0x5c) + fStack_fcc * *(float *)(uVar11 + 0x8c);
          auVar94._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x30) +
               local_ff8 * *(float *)(uVar11 + 0x60) + local_fd8 * *(float *)(uVar11 + 0x90);
          auVar94._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x34) +
               fStack_ff4 * *(float *)(uVar11 + 100) + fStack_fd4 * *(float *)(uVar11 + 0x94);
          auVar94._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x38) +
               fStack_ff0 * *(float *)(uVar11 + 0x68) + fStack_fd0 * *(float *)(uVar11 + 0x98);
          auVar94._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x3c) +
               fStack_fec * *(float *)(uVar11 + 0x6c) + fStack_fcc * *(float *)(uVar11 + 0x9c);
          fVar20 = (float)DAT_01f80d30;
          fVar38 = DAT_01f80d30._4_4_;
          fVar82 = DAT_01f80d30._8_4_;
          fVar66 = DAT_01f80d30._12_4_;
          auVar26._4_4_ = -(uint)(ABS(auVar84._4_4_) < fVar38);
          auVar26._0_4_ = -(uint)(ABS(auVar84._0_4_) < fVar20);
          auVar26._8_4_ = -(uint)(ABS(auVar84._8_4_) < fVar82);
          auVar26._12_4_ = -(uint)(ABS(auVar84._12_4_) < fVar66);
          auVar21 = blendvps(auVar84,_DAT_01f80d30,auVar26);
          auVar27._4_4_ = -(uint)(ABS(auVar94._4_4_) < fVar38);
          auVar27._0_4_ = -(uint)(ABS(auVar94._0_4_) < fVar20);
          auVar27._8_4_ = -(uint)(ABS(auVar94._8_4_) < fVar82);
          auVar27._12_4_ = -(uint)(ABS(auVar94._12_4_) < fVar66);
          auVar49 = blendvps(auVar94,_DAT_01f80d30,auVar27);
          auVar101._0_4_ = local_fe8 * *(float *)(uVar11 + 0x40) + auVar102._0_4_;
          auVar101._4_4_ = fStack_fe4 * *(float *)(uVar11 + 0x44) + auVar102._4_4_;
          auVar101._8_4_ = fStack_fe0 * *(float *)(uVar11 + 0x48) + auVar102._8_4_;
          auVar101._12_4_ = fStack_fdc * *(float *)(uVar11 + 0x4c) + auVar102._12_4_;
          auVar28._4_4_ = -(uint)(ABS(auVar101._4_4_) < fVar38);
          auVar28._0_4_ = -(uint)(ABS(auVar101._0_4_) < fVar20);
          auVar28._8_4_ = -(uint)(ABS(auVar101._8_4_) < fVar82);
          auVar28._12_4_ = -(uint)(ABS(auVar101._12_4_) < fVar66);
          auVar22 = blendvps(auVar101,_DAT_01f80d30,auVar28);
          auVar77 = rcpps(auVar102,auVar21);
          fVar20 = auVar77._0_4_;
          fVar38 = auVar77._4_4_;
          fVar82 = auVar77._8_4_;
          fVar66 = auVar77._12_4_;
          fVar20 = (1.0 - auVar21._0_4_ * fVar20) * fVar20 + fVar20;
          fVar38 = (1.0 - auVar21._4_4_ * fVar38) * fVar38 + fVar38;
          fVar82 = (1.0 - auVar21._8_4_ * fVar82) * fVar82 + fVar82;
          fVar66 = (1.0 - auVar21._12_4_ * fVar66) * fVar66 + fVar66;
          auVar21 = rcpps(auVar77,auVar49);
          fVar83 = auVar21._0_4_;
          fVar88 = auVar21._4_4_;
          fVar91 = auVar21._8_4_;
          fVar80 = auVar21._12_4_;
          fVar83 = (1.0 - auVar49._0_4_ * fVar83) * fVar83 + fVar83;
          fVar88 = (1.0 - auVar49._4_4_ * fVar88) * fVar88 + fVar88;
          fVar91 = (1.0 - auVar49._8_4_ * fVar91) * fVar91 + fVar91;
          fVar80 = (1.0 - auVar49._12_4_ * fVar80) * fVar80 + fVar80;
          auVar21 = rcpps(auVar21,auVar22);
          fVar93 = auVar21._0_4_;
          fVar97 = auVar21._4_4_;
          fVar99 = auVar21._8_4_;
          fVar81 = auVar21._12_4_;
          fVar93 = (1.0 - auVar22._0_4_ * fVar93) * fVar93 + fVar93;
          fVar97 = (1.0 - auVar22._4_4_ * fVar97) * fVar97 + fVar97;
          fVar99 = (1.0 - auVar22._8_4_ * fVar99) * fVar99 + fVar99;
          fVar81 = (1.0 - auVar22._12_4_ * fVar81) * fVar81 + fVar81;
          fVar56 = (*(float *)(uVar11 + 0x20) * local_1048 +
                   *(float *)(uVar11 + 0x50) * local_1058 +
                   *(float *)(uVar11 + 0x80) * fVar39 + *(float *)(uVar11 + 0xb0)) * -fVar20;
          fVar61 = (*(float *)(uVar11 + 0x24) * fStack_1044 +
                   *(float *)(uVar11 + 0x54) * fStack_1054 +
                   *(float *)(uVar11 + 0x84) * fVar103 + *(float *)(uVar11 + 0xb4)) * -fVar38;
          fVar62 = (*(float *)(uVar11 + 0x28) * fStack_1040 +
                   *(float *)(uVar11 + 0x58) * fStack_1050 +
                   *(float *)(uVar11 + 0x88) * fVar104 + *(float *)(uVar11 + 0xb8)) * -fVar82;
          fVar79 = (*(float *)(uVar11 + 0x2c) * fStack_103c +
                   *(float *)(uVar11 + 0x5c) * fStack_104c +
                   *(float *)(uVar11 + 0x8c) * fVar105 + *(float *)(uVar11 + 0xbc)) * -fVar66;
          fVar48 = (*(float *)(uVar11 + 0x30) * local_1048 +
                   *(float *)(uVar11 + 0x60) * local_1058 +
                   *(float *)(uVar11 + 0x90) * fVar39 + *(float *)(uVar11 + 0xc0)) * -fVar83;
          fVar53 = (*(float *)(uVar11 + 0x34) * fStack_1044 +
                   *(float *)(uVar11 + 100) * fStack_1054 +
                   *(float *)(uVar11 + 0x94) * fVar103 + *(float *)(uVar11 + 0xc4)) * -fVar88;
          fVar54 = (*(float *)(uVar11 + 0x38) * fStack_1040 +
                   *(float *)(uVar11 + 0x68) * fStack_1050 +
                   *(float *)(uVar11 + 0x98) * fVar104 + *(float *)(uVar11 + 200)) * -fVar91;
          fVar55 = (*(float *)(uVar11 + 0x3c) * fStack_103c +
                   *(float *)(uVar11 + 0x6c) * fStack_104c +
                   *(float *)(uVar11 + 0x9c) * fVar105 + *(float *)(uVar11 + 0xcc)) * -fVar80;
          fVar40 = (*(float *)(uVar11 + 0x40) * local_1048 +
                   local_1008 * local_1058 +
                   *(float *)(uVar11 + 0xa0) * fVar39 + *(float *)(uVar11 + 0xd0)) * -fVar93;
          fVar45 = (*(float *)(uVar11 + 0x44) * fStack_1044 +
                   fStack_1004 * fStack_1054 +
                   *(float *)(uVar11 + 0xa4) * fVar103 + *(float *)(uVar11 + 0xd4)) * -fVar97;
          fVar46 = (*(float *)(uVar11 + 0x48) * fStack_1040 +
                   fStack_1000 * fStack_1050 +
                   *(float *)(uVar11 + 0xa8) * fVar104 + *(float *)(uVar11 + 0xd8)) * -fVar99;
          fVar47 = (*(float *)(uVar11 + 0x4c) * fStack_103c +
                   fStack_ffc * fStack_104c +
                   *(float *)(uVar11 + 0xac) * fVar105 + *(float *)(uVar11 + 0xdc)) * -fVar81;
          fVar20 = fVar20 + fVar56;
          fVar38 = fVar38 + fVar61;
          fVar82 = fVar82 + fVar62;
          fVar66 = fVar66 + fVar79;
          fVar83 = fVar83 + fVar48;
          fVar88 = fVar88 + fVar53;
          fVar91 = fVar91 + fVar54;
          fVar80 = fVar80 + fVar55;
          fVar93 = fVar93 + fVar40;
          fVar97 = fVar97 + fVar45;
          fVar99 = fVar99 + fVar46;
          fVar81 = fVar81 + fVar47;
          auVar64._0_4_ =
               (uint)((int)fVar83 < (int)fVar48) * (int)fVar83 |
               (uint)((int)fVar83 >= (int)fVar48) * (int)fVar48;
          auVar64._4_4_ =
               (uint)((int)fVar88 < (int)fVar53) * (int)fVar88 |
               (uint)((int)fVar88 >= (int)fVar53) * (int)fVar53;
          auVar64._8_4_ =
               (uint)((int)fVar91 < (int)fVar54) * (int)fVar91 |
               (uint)((int)fVar91 >= (int)fVar54) * (int)fVar54;
          auVar64._12_4_ =
               (uint)((int)fVar80 < (int)fVar55) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar55) * (int)fVar55;
          auVar70._0_4_ =
               (uint)((int)fVar93 < (int)fVar40) * (int)fVar93 |
               (uint)((int)fVar93 >= (int)fVar40) * (int)fVar40;
          auVar70._4_4_ =
               (uint)((int)fVar97 < (int)fVar45) * (int)fVar97 |
               (uint)((int)fVar97 >= (int)fVar45) * (int)fVar45;
          auVar70._8_4_ =
               (uint)((int)fVar99 < (int)fVar46) * (int)fVar99 |
               (uint)((int)fVar99 >= (int)fVar46) * (int)fVar46;
          auVar70._12_4_ =
               (uint)((int)fVar81 < (int)fVar47) * (int)fVar81 |
               (uint)((int)fVar81 >= (int)fVar47) * (int)fVar47;
          auVar49 = maxps(auVar64,auVar70);
          auVar71._0_4_ =
               (uint)((int)fVar20 < (int)fVar56) * (int)fVar20 |
               (uint)((int)fVar20 >= (int)fVar56) * (int)fVar56;
          auVar71._4_4_ =
               (uint)((int)fVar38 < (int)fVar61) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar61) * (int)fVar61;
          auVar71._8_4_ =
               (uint)((int)fVar82 < (int)fVar62) * (int)fVar82 |
               (uint)((int)fVar82 >= (int)fVar62) * (int)fVar62;
          auVar71._12_4_ =
               (uint)((int)fVar66 < (int)fVar79) * (int)fVar66 |
               (uint)((int)fVar66 >= (int)fVar79) * (int)fVar79;
          auVar29._0_4_ =
               (uint)((int)fVar20 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar20 >= (int)fVar56) * (int)fVar20;
          auVar29._4_4_ =
               (uint)((int)fVar38 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar38 >= (int)fVar61) * (int)fVar38;
          auVar29._8_4_ =
               (uint)((int)fVar82 < (int)fVar62) * (int)fVar62 |
               (uint)((int)fVar82 >= (int)fVar62) * (int)fVar82;
          auVar29._12_4_ =
               (uint)((int)fVar66 < (int)fVar79) * (int)fVar79 |
               (uint)((int)fVar66 >= (int)fVar79) * (int)fVar66;
          auVar85._0_4_ =
               (uint)((int)fVar83 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar83 >= (int)fVar48) * (int)fVar83;
          auVar85._4_4_ =
               (uint)((int)fVar88 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar88 >= (int)fVar53) * (int)fVar88;
          auVar85._8_4_ =
               (uint)((int)fVar91 < (int)fVar54) * (int)fVar54 |
               (uint)((int)fVar91 >= (int)fVar54) * (int)fVar91;
          auVar85._12_4_ =
               (uint)((int)fVar80 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar80 >= (int)fVar55) * (int)fVar80;
          auVar95._0_4_ =
               (uint)((int)fVar93 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar93 >= (int)fVar40) * (int)fVar93;
          auVar95._4_4_ =
               (uint)((int)fVar97 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar97 >= (int)fVar45) * (int)fVar97;
          auVar95._8_4_ =
               (uint)((int)fVar99 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar99 >= (int)fVar46) * (int)fVar99;
          auVar95._12_4_ =
               (uint)((int)fVar81 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar81 >= (int)fVar47) * (int)fVar81;
          auVar22 = minps(auVar85,auVar95);
          auVar21 = maxps(local_1018,auVar71);
          auVar21 = maxps(auVar21,auVar49);
          auVar51._4_4_ = fVar19;
          auVar51._0_4_ = fVar74;
          auVar51._8_4_ = fVar67;
          auVar51._12_4_ = fVar75;
          auVar49 = minps(auVar51,auVar29);
          auVar49 = minps(auVar49,auVar22);
          local_10c8._0_4_ = auVar21._0_4_ * 0.99999964;
          local_10c8._4_4_ = auVar21._4_4_ * 0.99999964;
          fStack_10c0 = auVar21._8_4_ * 0.99999964;
          fStack_10bc = auVar21._12_4_ * 0.99999964;
          auVar43._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar49._4_4_ * 1.0000004);
          auVar43._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar49._0_4_ * 1.0000004);
          auVar43._8_4_ = -(uint)(fStack_10c0 <= auVar49._8_4_ * 1.0000004);
          auVar43._12_4_ = -(uint)(fStack_10bc <= auVar49._12_4_ * 1.0000004);
          uVar12 = movmskps((int)context,auVar43);
          auVar78 = local_1018;
          fVar82 = local_1068;
          fVar66 = fStack_1064;
          fVar40 = fStack_1060;
          fVar45 = fStack_105c;
          fVar38 = local_1058;
          fVar46 = fStack_1054;
          fVar47 = fStack_1050;
          fVar48 = fStack_104c;
          fVar20 = local_1048;
          fVar53 = fStack_1044;
          fVar54 = fStack_1040;
          fVar55 = fStack_103c;
          fVar79 = local_10a8;
          fVar56 = fStack_10a4;
          fVar61 = fStack_10a0;
          fVar62 = fStack_109c;
          fVar80 = local_10b8;
          fVar83 = fStack_10b4;
          fVar88 = fStack_10b0;
          fVar91 = fStack_10ac;
          fVar81 = local_1028;
          fVar93 = fStack_1024;
          fVar97 = fStack_1020;
          fVar99 = fStack_101c;
          fVar89 = local_1038;
          fVar87 = fStack_1034;
          fVar90 = fStack_1030;
          fVar92 = fStack_102c;
          fVar86 = local_1078;
          fVar96 = fStack_1074;
          fVar98 = fStack_1070;
          fVar100 = fStack_106c;
        }
        context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar12);
        if (context == (RayQueryContext *)0x0) goto LAB_00d8c14c;
        uVar11 = uVar10 & 0xfffffffffffffff0;
        lVar7 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar11 + lVar7 * 8);
        uVar12 = uVar12 - 1 & uVar12;
        if (uVar12 != 0) {
          uVar3 = *(uint *)(local_10c8 + lVar7 * 4);
          lVar7 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar11 + lVar7 * 8);
          uVar4 = *(uint *)(local_10c8 + lVar7 * 4);
          uVar12 = uVar12 - 1 & uVar12;
          context = (RayQueryContext *)(ulong)uVar12;
          if (uVar12 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar15 = uVar5;
              *(uint *)((long)*pauVar15 + 8) = uVar4;
              pauVar15 = pauVar15 + 1;
            }
            else {
              *(ulong *)*pauVar15 = uVar10;
              *(uint *)((long)*pauVar15 + 8) = uVar3;
              uVar10 = uVar5;
              pauVar15 = pauVar15 + 1;
            }
          }
          else {
            auVar44._8_4_ = uVar3;
            auVar44._0_8_ = uVar10;
            auVar44._12_4_ = 0;
            auVar59._8_4_ = uVar4;
            auVar59._0_8_ = uVar5;
            auVar59._12_4_ = 0;
            lVar7 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar6 = *(undefined8 *)(uVar11 + lVar7 * 8);
            iVar18 = *(int *)(local_10c8 + lVar7 * 4);
            auVar52._8_4_ = iVar18;
            auVar52._0_8_ = uVar6;
            auVar52._12_4_ = 0;
            uVar12 = uVar12 - 1 & uVar12;
            if (uVar12 == 0) {
              auVar30._8_4_ = -(uint)((int)uVar3 < (int)uVar4);
              auVar30._4_4_ = auVar30._8_4_;
              auVar30._0_4_ = auVar30._8_4_;
              auVar30._12_4_ = auVar30._8_4_;
              auVar65._8_4_ = uVar4;
              auVar65._0_8_ = uVar5;
              auVar65._12_4_ = 0;
              auVar49 = blendvps(auVar65,auVar44,auVar30);
              auVar21 = blendvps(auVar44,auVar59,auVar30);
              auVar31._8_4_ = -(uint)(auVar49._8_4_ < iVar18);
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar60._8_4_ = iVar18;
              auVar60._0_8_ = uVar6;
              auVar60._12_4_ = 0;
              auVar22 = blendvps(auVar60,auVar49,auVar31);
              auVar77 = blendvps(auVar49,auVar52,auVar31);
              auVar32._8_4_ = -(uint)(auVar21._8_4_ < auVar77._8_4_);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar49 = blendvps(auVar77,auVar21,auVar32);
              auVar21 = blendvps(auVar21,auVar77,auVar32);
              *pauVar15 = auVar21;
              pauVar15[1] = auVar49;
              uVar10 = auVar22._0_8_;
              pauVar15 = pauVar15 + 2;
            }
            else {
              lVar7 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              auVar33._8_4_ = -(uint)((int)uVar3 < (int)uVar4);
              auVar33._4_4_ = auVar33._8_4_;
              auVar33._0_4_ = auVar33._8_4_;
              auVar33._12_4_ = auVar33._8_4_;
              auVar77 = blendvps(auVar59,auVar44,auVar33);
              auVar21 = blendvps(auVar44,auVar59,auVar33);
              auVar72._8_4_ = *(int *)(local_10c8 + lVar7 * 4);
              auVar72._0_8_ = *(undefined8 *)(uVar11 + lVar7 * 8);
              auVar72._12_4_ = 0;
              auVar34._8_4_ = -(uint)(iVar18 < *(int *)(local_10c8 + lVar7 * 4));
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar22 = blendvps(auVar72,auVar52,auVar34);
              auVar49 = blendvps(auVar52,auVar72,auVar34);
              auVar35._8_4_ = -(uint)(auVar21._8_4_ < auVar49._8_4_);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar73 = blendvps(auVar49,auVar21,auVar35);
              auVar21 = blendvps(auVar21,auVar49,auVar35);
              auVar36._8_4_ = -(uint)(auVar77._8_4_ < auVar22._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar49 = blendvps(auVar22,auVar77,auVar36);
              auVar77 = blendvps(auVar77,auVar22,auVar36);
              auVar37._8_4_ = -(uint)(auVar77._8_4_ < auVar73._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar22 = blendvps(auVar73,auVar77,auVar37);
              auVar77 = blendvps(auVar77,auVar73,auVar37);
              *pauVar15 = auVar21;
              pauVar15[1] = auVar77;
              pauVar15[2] = auVar22;
              uVar10 = auVar49._0_8_;
              pauVar15 = pauVar15 + 3;
              fVar79 = local_10a8;
              fVar56 = fStack_10a4;
              fVar61 = fStack_10a0;
              fVar62 = fStack_109c;
              fVar80 = local_10b8;
              fVar83 = fStack_10b4;
              fVar88 = fStack_10b0;
              fVar91 = fStack_10ac;
            }
          }
        }
        goto LAB_00d8bbb7;
      }
LAB_00d8c14c:
    } while (pauVar15 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }